

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O1

void __thiscall
slang::IntervalMap<int,_int,_0U>::insert
          (IntervalMap<int,_int,_0U> *this,int left,int right,int *value,allocator_type *alloc)

{
  char *pcVar1;
  uint size;
  uint32_t uVar2;
  ulong uVar3;
  iterator it;
  const_iterator local_70;
  
  if (this->height == 0) {
    size = this->rootSize;
    if ((ulong)size != 0x10) {
      if (size != 0) {
        uVar3 = 0;
        do {
          if (left <= *(int *)((long)&this->field_0 + uVar3 * 8)) goto LAB_0050a2dc;
          uVar3 = uVar3 + 1;
        } while (size != uVar3);
      }
      uVar3 = (ulong)size;
LAB_0050a2dc:
      local_70.map = (IntervalMap<int,_int,_0U> *)CONCAT44(right,left);
      uVar2 = IntervalMapDetails::LeafNode<int,_int,_16U,_true>::insertFrom
                        ((LeafNode<int,_int,_16U,_true> *)this,(uint32_t)uVar3,size,
                         (interval<int> *)&local_70,value);
      this->rootSize = uVar2;
      return;
    }
  }
  pcVar1 = local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.
           firstElement;
  local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.len = 0;
  local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.cap = 2;
  local_70.map = this;
  local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ =
       (pointer)pcVar1;
  const_iterator::setToFind(&local_70,left,right);
  iterator::insert((iterator *)&local_70,left,right,value,alloc);
  if (local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>.data_ !=
      (pointer)pcVar1) {
    operator_delete(local_70.path.path.super_SmallVectorBase<slang::IntervalMapDetails::Path::Entry>
                    .data_);
  }
  return;
}

Assistant:

void insert(TKey left, TKey right, const TValue& value, allocator_type& alloc) {
        if (isFlat() && rootSize != RootLeaf::Capacity) {
            uint32_t i = rootLeaf.find(rootSize, {left, right});
            rootSize = rootLeaf.insertFrom(i, rootSize, {left, right}, value);
        }
        else {
            iterator it(*this);
            it.setToFind(left, right);
            it.insert(left, right, value, alloc);
        }
    }